

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contexts.h
# Opt level: O0

Result<unsigned_int> * __thiscall
wasm::WATParser::ParseDefsCtx::getFieldFromName
          (Result<unsigned_int> *__return_storage_ptr__,ParseDefsCtx *this,HeapType type,Name name)

{
  bool bVar1;
  pointer pvVar2;
  pointer pvVar3;
  allocator<char> local_99;
  string local_98;
  Err local_78;
  _Node_iterator_base<std::pair<const_wasm::Name,_unsigned_int>,_true> local_58;
  _Node_iterator_base<std::pair<const_wasm::Name,_unsigned_int>,_true> local_50;
  const_iterator fieldIt;
  unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
  *fieldIdxs;
  _Node_iterator_base<std::pair<const_wasm::HeapType,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>_>,_true>
  local_38;
  const_iterator typeIt;
  ParseDefsCtx *this_local;
  Name name_local;
  HeapType type_local;
  
  name_local.super_IString.str._M_len = name.super_IString.str._M_str;
  this_local = name.super_IString.str._M_len;
  typeIt.
  super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>_>,_true>
  ._M_cur = (_Node_iterator_base<std::pair<const_wasm::HeapType,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>_>,_true>
             )(_Node_iterator_base<std::pair<const_wasm::HeapType,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>_>,_true>
               )this;
  name_local.super_IString.str._M_str = (char *)type.id;
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<wasm::HeapType,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>_>_>_>
       ::find(this->typeNames,(key_type *)&name_local.super_IString.str._M_str);
  fieldIdxs = (unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
               *)std::
                 unordered_map<wasm::HeapType,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>_>_>_>
                 ::end(this->typeNames);
  bVar1 = std::__detail::operator!=
                    (&local_38,
                     (_Node_iterator_base<std::pair<const_wasm::HeapType,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>_>,_true>
                      *)&fieldIdxs);
  if (bVar1) {
    pvVar2 = std::__detail::
             _Node_const_iterator<std::pair<const_wasm::HeapType,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>_>,_false,_true>
             ::operator->((_Node_const_iterator<std::pair<const_wasm::HeapType,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>_>,_false,_true>
                           *)&local_38);
    fieldIt.super__Node_iterator_base<std::pair<const_wasm::Name,_unsigned_int>,_true>._M_cur =
         (_Node_iterator_base<std::pair<const_wasm::Name,_unsigned_int>,_true>)&pvVar2->second;
    local_50._M_cur =
         (__node_type *)
         std::
         unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
         ::find((unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
                 *)fieldIt.
                   super__Node_iterator_base<std::pair<const_wasm::Name,_unsigned_int>,_true>._M_cur
                ,(key_type *)&this_local);
    local_58._M_cur =
         (__node_type *)
         std::
         unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
         ::end(fieldIt.super__Node_iterator_base<std::pair<const_wasm::Name,_unsigned_int>,_true>.
               _M_cur);
    bVar1 = std::__detail::operator!=(&local_50,&local_58);
    if (bVar1) {
      pvVar3 = std::__detail::
               _Node_const_iterator<std::pair<const_wasm::Name,_unsigned_int>,_false,_true>::
               operator->((_Node_const_iterator<std::pair<const_wasm::Name,_unsigned_int>,_false,_true>
                           *)&local_50);
      Result<unsigned_int>::Result<unsigned_int_const&>(__return_storage_ptr__,&pvVar3->second);
      return __return_storage_ptr__;
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"unrecognized field name",&local_99);
  Lexer::err(&local_78,&this->in,&local_98);
  Result<unsigned_int>::Result(__return_storage_ptr__,&local_78);
  wasm::Err::~Err(&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  return __return_storage_ptr__;
}

Assistant:

Result<Index> getFieldFromName(HeapType type, Name name) {
    if (auto typeIt = typeNames.find(type); typeIt != typeNames.end()) {
      const auto& fieldIdxs = typeIt->second;
      if (auto fieldIt = fieldIdxs.find(name); fieldIt != fieldIdxs.end()) {
        return fieldIt->second;
      }
    }
    return in.err("unrecognized field name");
  }